

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall
QL_Manager::SetUpNodesWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,int nSelAttrs,RelAttr *selAttrs)

{
  QL_Node *prevNode;
  char *__s;
  RC RVar1;
  size_t __n;
  QL_NodeProj *this_00;
  ulong uVar2;
  int i;
  int iVar3;
  ulong uVar4;
  RelAttr attr;
  int attrIndex;
  ulong local_38;
  
  RVar1 = SetUpFirstNodeWithQO(this,topNode,qorels);
  if (RVar1 != 0) {
    return RVar1;
  }
  iVar3 = 1;
  local_38 = (ulong)(uint)nSelAttrs;
  while (prevNode = *topNode, iVar3 < this->nRels) {
    RVar1 = JoinRelationWithQO(this,topNode,qorels,prevNode,iVar3);
    iVar3 = iVar3 + 1;
    if (RVar1 != 0) {
      return RVar1;
    }
  }
  uVar2 = local_38;
  if ((int)local_38 == 1) {
    __s = selAttrs->attrName;
    __n = strlen(__s);
    uVar2 = local_38;
    iVar3 = strncmp(__s,"*",__n);
    if (iVar3 == 0) {
      return 0;
    }
  }
  this_00 = (QL_NodeProj *)operator_new(0x60);
  QL_NodeProj::QL_NodeProj(this_00,this,prevNode);
  QL_NodeProj::SetUpNode(this_00,(int)uVar2);
  uVar4 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  uVar2 = 0;
  do {
    if (uVar4 * 0x10 + 0x10 == uVar2 + 0x10) {
      *topNode = (QL_Node *)this_00;
      return 0;
    }
    attrIndex = 0;
    attr.attrName = *(char **)((long)&selAttrs->attrName + uVar2);
    attr.relName = *(char **)((long)&selAttrs->relName + uVar2);
    RVar1 = GetAttrCatEntryPos(this,attr,&attrIndex);
  } while ((RVar1 == 0) &&
          (RVar1 = QL_NodeProj::AddProj(this_00,attrIndex), uVar2 = uVar2 + 0x10, RVar1 == 0));
  return RVar1;
}

Assistant:

RC QL_Manager::SetUpNodesWithQO(QL_Node *&topNode, QO_Rel* qorels, int nSelAttrs, const RelAttr selAttrs[]){
  RC rc = 0;
  if((rc = SetUpFirstNodeWithQO(topNode, qorels)))
    return (rc);

  // For all other relations, join it, left-deep style, with the previously
  // seen relations
  QL_Node* currNode;
  currNode = topNode;
  for(int i = 1; i < nRels; i++){
    if((rc = JoinRelationWithQO(topNode, qorels, currNode, i)))
      return (rc);
    currNode = topNode;
  }

  // If select *, don't add project nodes
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);
  // Otherwise, add a project node, and give it the attributes to project
  QL_NodeProj *projNode = new QL_NodeProj(*this, *currNode);
  projNode->SetUpNode(nSelAttrs);
  for(int i= 0 ; i < nSelAttrs; i++){
    int attrIndex = 0;
    if((rc = GetAttrCatEntryPos(selAttrs[i], attrIndex)))
      return (rc);
    if((rc = projNode->AddProj(attrIndex)))
      return (rc);
  }
  topNode = projNode;
  return (rc);
}